

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fade.c
# Opt level: O3

int mixed_make_segment_fade
              (float from,float to,float time,mixed_fade_type type,uint32_t samplerate,
              mixed_segment *segment)

{
  void *pvVar1;
  
  pvVar1 = (*mixed_calloc)(1,0x28);
  if (pvVar1 == (void *)0x0) {
    mixed_err(1);
  }
  else {
    *(float *)((long)pvVar1 + 0x10) = from;
    *(float *)((long)pvVar1 + 0x14) = to;
    *(float *)((long)pvVar1 + 0x18) = time;
    *(mixed_fade_type *)((long)pvVar1 + 0x1c) = type;
    *(uint32_t *)((long)pvVar1 + 0x20) = samplerate;
    segment->free = fade_segment_free;
    segment->start = fade_segment_start;
    segment->mix = (_func_int_mixed_segment_ptr *)&LAB_001051a0;
    segment->set_in = fade_segment_set_in;
    segment->set_out = fade_segment_set_out;
    segment->info = fade_segment_info;
    segment->get = fade_segment_get;
    segment->set = fade_segment_set;
    segment->data = pvVar1;
  }
  return (uint)(pvVar1 != (void *)0x0);
}

Assistant:

MIXED_EXPORT int mixed_make_segment_fade(float from, float to, float time, enum mixed_fade_type type, uint32_t samplerate, struct mixed_segment *segment){
  struct fade_segment_data *data = mixed_calloc(1, sizeof(struct fade_segment_data));
  if(!data){
    mixed_err(MIXED_OUT_OF_MEMORY);
    return 0;
  }

  data->from = from;
  data->to = to;
  data->time = time;
  data->type = type;
  data->samplerate = samplerate;
  
  segment->free = fade_segment_free;
  segment->start = fade_segment_start;
  segment->mix = fade_segment_mix;
  segment->set_in = fade_segment_set_in;
  segment->set_out = fade_segment_set_out;
  segment->info = fade_segment_info;
  segment->get = fade_segment_get;
  segment->set = fade_segment_set;
  segment->data = data;
  return 1;
}